

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Caliper.cpp
# Opt level: O3

void __thiscall
cali::Caliper::push_snapshot_replace
          (Caliper *this,ChannelBody *chB,SnapshotView trigger_info,Entry *target)

{
  SnapshotBuilder *pSVar1;
  size_t *psVar2;
  int iVar3;
  ThreadData *pTVar4;
  ThreadData *pTVar5;
  GlobalData *pGVar6;
  ThreadData *pTVar7;
  pointer pfVar8;
  Entry *pEVar9;
  SnapshotView __args_1;
  size_t sVar10;
  ChannelBody *pCVar11;
  int iVar12;
  size_t sVar13;
  unsigned_long __n2;
  ulong uVar14;
  ulong uVar15;
  function<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotView)> *f;
  pointer this_00;
  SnapshotView __args_2;
  SnapshotView local_68;
  pthread_mutex_t *local_58;
  SnapshotBuilder *local_50;
  ChannelBody *local_48;
  Entry *local_40;
  Caliper *local_38;
  
  local_68.m_len = trigger_info.m_len;
  local_68.m_data = trigger_info.m_data;
  pTVar4 = this->sT;
  (pTVar4->lock).m_lock = (pTVar4->lock).m_lock + 1;
  (pTVar4->snapshot).m_builder.m_data = (pTVar4->snapshot).m_data;
  (pTVar4->snapshot).m_builder.m_capacity = 0x78;
  (pTVar4->snapshot).m_builder.m_len = 0;
  (pTVar4->snapshot).m_builder.m_skipped = 0;
  pTVar5 = this->sT;
  pSVar1 = &(pTVar5->snapshot).m_builder;
  local_48 = chB;
  local_40 = target;
  Blackboard::snapshot(&pTVar5->thread_blackboard,pSVar1);
  pGVar6 = this->sG;
  pTVar7 = this->sT;
  iVar3 = (pGVar6->process_blackboard).ucount.super___atomic_base<int>._M_i;
  local_50 = pSVar1;
  if (pTVar7->process_bb_count < iVar3) {
    local_58 = (pthread_mutex_t *)&pGVar6->process_blackboard_lock;
    (pTVar7->process_snapshot).m_builder.m_data = (pTVar7->process_snapshot).m_data;
    (pTVar7->process_snapshot).m_builder.m_capacity = 0x78;
    (pTVar7->process_snapshot).m_builder.m_len = 0;
    (pTVar7->process_snapshot).m_builder.m_skipped = 0;
    iVar12 = pthread_mutex_lock(local_58);
    if (iVar12 != 0) {
      std::__throw_system_error(iVar12);
    }
    Blackboard::snapshot(&pGVar6->process_blackboard,&(pTVar7->process_snapshot).m_builder);
    pTVar7->process_bb_count = iVar3;
    pthread_mutex_unlock(local_58);
  }
  uVar15 = (this->sT->process_snapshot).m_builder.m_len;
  sVar13 = (pTVar5->snapshot).m_builder.m_len;
  uVar14 = (pTVar5->snapshot).m_builder.m_capacity - sVar13;
  if (uVar15 <= uVar14) {
    uVar14 = uVar15;
  }
  if (uVar14 != 0) {
    memmove((pTVar5->snapshot).m_builder.m_data + sVar13,
            (this->sT->process_snapshot).m_builder.m_data,uVar14 * 0x18);
    sVar13 = (pTVar5->snapshot).m_builder.m_len;
  }
  pSVar1 = local_50;
  (pTVar5->snapshot).m_builder.m_len = sVar13 + uVar14;
  psVar2 = &(pTVar5->snapshot).m_builder.m_skipped;
  *psVar2 = *psVar2 + (uVar15 - uVar14);
  SnapshotBuilder::remove(local_50,(char *)local_40);
  sVar10 = local_68.m_len;
  sVar13 = (pTVar5->snapshot).m_builder.m_len;
  uVar15 = (pTVar5->snapshot).m_builder.m_capacity - sVar13;
  if (local_68.m_len <= uVar15) {
    uVar15 = local_68.m_len;
  }
  if (uVar15 != 0) {
    memmove((pTVar5->snapshot).m_builder.m_data + sVar13,local_68.m_data,uVar15 * 0x18);
    sVar13 = (pTVar5->snapshot).m_builder.m_len;
  }
  pCVar11 = local_48;
  (pTVar5->snapshot).m_builder.m_len = sVar13 + uVar15;
  psVar2 = &(pTVar5->snapshot).m_builder.m_skipped;
  *psVar2 = *psVar2 + (sVar10 - uVar15);
  local_38 = this;
  util::callback<void(cali::Caliper*,cali::SnapshotView,cali::SnapshotBuilder&)>::operator()
            ((callback<void(cali::Caliper*,cali::SnapshotView,cali::SnapshotBuilder&)> *)
             &(local_48->events).snapshot,&local_38,&local_68,pSVar1);
  this_00 = (pCVar11->events).process_snapshot.mCb.
            super__Vector_base<std::function<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotView)>,_std::allocator<std::function<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotView)>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pfVar8 = (pCVar11->events).process_snapshot.mCb.
           super__Vector_base<std::function<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotView)>,_std::allocator<std::function<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotView)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pfVar8) {
    pEVar9 = (pTVar5->snapshot).m_builder.m_data;
    sVar13 = (pTVar5->snapshot).m_builder.m_len;
    do {
      __args_1.m_len = local_68.m_len;
      __args_1.m_data = local_68.m_data;
      __args_2.m_len = sVar13;
      __args_2.m_data = pEVar9;
      std::function<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotView)>::operator()
                (this_00,this,__args_1,__args_2);
      this_00 = this_00 + 1;
    } while (this_00 != pfVar8);
  }
  (pTVar4->lock).m_lock = (pTVar4->lock).m_lock + -1;
  return;
}

Assistant:

void Caliper::push_snapshot_replace(ChannelBody* chB, SnapshotView trigger_info, const Entry& target)
{
    std::lock_guard<::siglock> g(sT->lock);

    sT->snapshot.reset();
    SnapshotBuilder& rec = sT->snapshot.builder();

    sT->thread_blackboard.snapshot(rec);
    sT->update_process_snapshot(sG->process_blackboard, sG->process_blackboard_lock);
    rec.append(sT->process_snapshot.view());

    // remove/replace target entry from blackboard snapshot
    rec.remove(target);
    rec.append(trigger_info);

    chB->events.snapshot(this, trigger_info, rec);
    chB->events.process_snapshot(this, trigger_info, rec.view());
}